

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaDDir.cpp
# Opt level: O0

void __thiscall NaDataDirector::StartEpoch(NaDataDirector *this,NaDataDirIterKind ik)

{
  uint uVar1;
  int in_ESI;
  NaDataDirector *in_RDI;
  uint i;
  uint local_10;
  
  if (in_ESI == 0) {
    in_RDI->eIterKind = ddikSequence;
    in_RDI->nIterDone = 0;
    in_RDI->iIndex = 0;
  }
  else if (in_ESI == 1) {
    in_RDI->eIterKind = ddikRandomized;
    in_RDI->nIterDone = 0;
    in_RDI->iIndex = 0;
    for (local_10 = 0; uVar1 = GetEpochLen(in_RDI), local_10 < uVar1; local_10 = local_10 + 1) {
      in_RDI->bUsed[local_10] = false;
    }
  }
  return;
}

Assistant:

void        NaDataDirector::StartEpoch (NaDataDirIterKind ik)
{
    switch(ik){

    case ddikSequence:
        eIterKind = ik;
        iIndex = nIterDone = 0;
        break;

    case ddikRandomized:
        eIterKind = ik;
        iIndex = nIterDone = 0;
        for(unsigned i = 0; i < GetEpochLen(); ++i){
            bUsed[i] = false;
        }
        break;
    }
}